

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

string * pbrt::RemoveExtension(string *__return_storage_ptr__,string *filename)

{
  string ext;
  string local_60;
  path local_40;
  
  filesystem::path::path(&local_40,filename);
  filesystem::path::extension_abi_cxx11_(&local_60,&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40.m_path);
  if (local_60._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
    std::__cxx11::string::erase
              (__return_storage_ptr__,
               (__return_storage_ptr__->_M_dataplus)._M_p +
               ~local_60._M_string_length + __return_storage_ptr__->_M_string_length);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string RemoveExtension(const std::string &filename) {
    std::string ext = filesystem::path(filename).extension();
    if (ext.empty())
        return filename;
    std::string f = filename;
    f.erase(f.end() - ext.size() - 1, f.end());
    return f;
}